

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse2_128_64.c
# Opt level: O3

parasail_result_t *
parasail_sw_diag_sse2_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  parasail_result_t *ppVar5;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  int64_t iVar15;
  ulong uVar16;
  uint uVar17;
  int iVar22;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar38;
  long lVar39;
  int iVar50;
  __m128i_64_t A;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar49;
  int iVar51;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  __m128i_64_t A_1;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  int iVar66;
  int iVar70;
  int iVar71;
  int iVar72;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  __m128i_64_t B_4;
  __m128i_64_t B_2;
  undefined1 auVar77 [16];
  __m128i_64_t B_1;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  int64_t *local_140;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  ulong uStack_100;
  undefined1 local_f8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined8 local_a0;
  undefined1 local_98 [16];
  long local_88;
  undefined8 uStack_80;
  ulong local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  int local_48;
  undefined4 uStack_44;
  int iStack_40;
  undefined4 uStack_3c;
  long lVar37;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_diag_sse2_128_64_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_diag_sse2_128_64_cold_6();
  }
  else if (open < 0) {
    parasail_sw_diag_sse2_128_64_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_diag_sse2_128_64_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_diag_sse2_128_64_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_sw_diag_sse2_128_64_cold_2();
        return (parasail_result_t *)0x0;
      }
      uVar12 = (ulong)(uint)_s1Len;
      if (_s1Len < 1) {
        parasail_sw_diag_sse2_128_64_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      uVar12 = (ulong)(uint)matrix->length;
    }
    iVar22 = matrix->min;
    uVar6 = 0x8000000000000000 - (long)iVar22;
    if (iVar22 != -open && SBORROW4(iVar22,-open) == iVar22 + open < 0) {
      uVar6 = (ulong)(uint)open | 0x8000000000000000;
    }
    lVar10 = uVar6 + 1;
    iVar22 = matrix->max;
    auVar25._8_4_ = (int)lVar10;
    auVar25._0_8_ = lVar10;
    auVar25._12_4_ = (int)((ulong)lVar10 >> 0x20);
    local_c8 = auVar25;
    local_b8 = auVar25;
    local_98 = auVar25;
    ppVar5 = parasail_result_new();
    if (ppVar5 != (parasail_result_t *)0x0) {
      ppVar5->flag = ppVar5->flag | 0x2801004;
      uVar9 = (ulong)(s2Len + 2);
      local_a0 = uVar6;
      ptr = parasail_memalign_int64_t(0x10,uVar9);
      ptr_00 = parasail_memalign_int64_t(0x10,uVar9);
      ptr_01 = parasail_memalign_int64_t(0x10,uVar9);
      if (ptr_01 != (int64_t *)0x0 && (ptr_00 != (int64_t *)0x0 && ptr != (int64_t *)0x0)) {
        iVar4 = (int)uVar12;
        lVar14 = (long)iVar4;
        if (matrix->type == 0) {
          local_140 = parasail_memalign_int64_t(0x10,(long)(iVar4 + 1));
          if (local_140 == (int64_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < iVar4) {
            piVar1 = matrix->mapper;
            lVar8 = 0;
            do {
              local_140[lVar8] = (long)piVar1[(byte)_s1[lVar8]];
              lVar8 = lVar8 + 1;
            } while (lVar14 != lVar8);
          }
          local_140[lVar14] = 0;
        }
        else {
          local_140 = (int64_t *)0x0;
        }
        local_88 = 0x7ffffffffffffffe - (long)iVar22;
        uStack_80 = 0;
        uVar17 = (uint)local_88;
        iVar22 = (int)((ulong)local_88 >> 0x20);
        local_118._8_4_ = uVar17;
        local_118._0_8_ = local_88;
        local_118._12_4_ = iVar22;
        uStack_100 = auVar25._8_8_;
        local_78 = uStack_100;
        uStack_70 = 0;
        local_48 = open;
        uStack_44 = 0;
        iStack_40 = open;
        uStack_3c = 0;
        local_58._0_8_ = CONCAT44(0,gap);
        local_58._8_4_ = gap;
        local_58._12_4_ = 0;
        auVar2 = local_58;
        uVar6 = (ulong)(uint)s2Len;
        piVar1 = matrix->mapper;
        uVar9 = 0;
        do {
          ptr[uVar9 + 1] = (long)piVar1[(byte)_s2[uVar9]];
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
        uVar9 = 0;
        *ptr = 0;
        ptr[uVar6 + 1] = 0;
        do {
          ptr_00[uVar9 + 1] = 0;
          ptr_01[uVar9 + 1] = lVar10;
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
        *ptr_00 = lVar10;
        *ptr_01 = lVar10;
        ptr_00[uVar6 + 1] = lVar10;
        ptr_01[uVar6 + 1] = lVar10;
        auVar20 = _DAT_00904920;
        local_98 = auVar25;
        local_c8 = auVar25;
        local_b8 = auVar25;
        local_128 = auVar25;
        if (0 < iVar4) {
          piVar1 = matrix->matrix;
          iVar7 = matrix->size;
          iVar26 = matrix->type;
          auVar23._8_4_ = iVar4;
          auVar23._0_8_ = uVar12;
          auVar23._12_4_ = 0;
          local_f8 = ZEXT416(1);
          uVar12 = 0;
          local_68 = auVar23 ^ _DAT_00904920;
          auVar23 = local_68;
          do {
            if (iVar26 == 0) {
              uVar9 = local_140[uVar12];
              iVar15 = local_140[uVar12 + 1];
            }
            else {
              uVar13 = (uint)uVar12 | 1;
              if (lVar14 <= (long)(uVar12 | 1)) {
                uVar13 = iVar4 - 1;
              }
              iVar15 = (int64_t)(int)uVar13;
              uVar9 = uVar12;
            }
            uVar16 = 0;
            auVar81 = ZEXT816(0xffffffffffffffff);
            auVar18._8_8_ = 0;
            auVar18._0_8_ = uStack_100;
            auVar73 = auVar25;
            auVar41 = auVar18;
            auVar54 = auVar25;
            do {
              auVar59._0_8_ = (long)piVar1[iVar15 * iVar7 + ptr[uVar16]] + auVar18._0_8_;
              auVar59._8_8_ = (long)piVar1[uVar9 * (long)iVar7 + ptr[uVar16 + 1]] + auVar18._8_8_;
              lVar39 = auVar41._8_8_;
              lVar8 = ptr_00[uVar16 + 1];
              auVar40._0_8_ = lVar39 - (ulong)(uint)open;
              auVar40._8_8_ = lVar8 - (ulong)(uint)open;
              local_58._12_4_ = 0;
              auVar52._0_8_ = auVar73._8_8_ - local_58._0_8_;
              auVar52._8_8_ = ptr_01[uVar16 + 1] - local_58._8_8_;
              auVar77._0_8_ = auVar41._0_8_ - (ulong)(uint)open;
              auVar77._8_8_ = lVar39 - (ulong)(uint)open;
              auVar78._0_8_ = auVar54._0_8_ - local_58._0_8_;
              auVar78._8_8_ = auVar54._8_8_ - local_58._8_8_;
              auVar18 = auVar52 ^ auVar20;
              auVar73 = auVar40 ^ auVar20;
              iVar66 = -(uint)(auVar18._0_4_ < auVar73._0_4_);
              iVar70 = -(uint)(auVar18._4_4_ < auVar73._4_4_);
              iVar71 = -(uint)(auVar18._8_4_ < auVar73._8_4_);
              iVar72 = -(uint)(auVar18._12_4_ < auVar73._12_4_);
              auVar41._4_4_ = iVar66;
              auVar41._0_4_ = iVar66;
              auVar41._8_4_ = iVar71;
              auVar41._12_4_ = iVar71;
              auVar74._4_4_ = -(uint)(auVar73._4_4_ == auVar18._4_4_);
              auVar74._12_4_ = -(uint)(auVar73._12_4_ == auVar18._12_4_);
              auVar74._0_4_ = auVar74._4_4_;
              auVar74._8_4_ = auVar74._12_4_;
              auVar73._4_4_ = iVar70;
              auVar73._0_4_ = iVar70;
              auVar73._8_4_ = iVar72;
              auVar73._12_4_ = iVar72;
              auVar73 = auVar73 | auVar74 & auVar41;
              auVar18 = ~auVar73 & auVar52 | auVar40 & auVar73;
              auVar73 = auVar78 ^ auVar20;
              auVar41 = auVar77 ^ auVar20;
              iVar66 = -(uint)(auVar73._0_4_ < auVar41._0_4_);
              auVar53._4_4_ = -(uint)(auVar73._4_4_ < auVar41._4_4_);
              iVar70 = -(uint)(auVar73._8_4_ < auVar41._8_4_);
              auVar53._12_4_ = -(uint)(auVar73._12_4_ < auVar41._12_4_);
              auVar67._4_4_ = iVar66;
              auVar67._0_4_ = iVar66;
              auVar67._8_4_ = iVar70;
              auVar67._12_4_ = iVar70;
              iVar66 = -(uint)(auVar41._4_4_ == auVar73._4_4_);
              iVar70 = -(uint)(auVar41._12_4_ == auVar73._12_4_);
              auVar54._4_4_ = iVar66;
              auVar54._0_4_ = iVar66;
              auVar54._8_4_ = iVar70;
              auVar54._12_4_ = iVar70;
              auVar53._0_4_ = auVar53._4_4_;
              auVar53._8_4_ = auVar53._12_4_;
              auVar53 = auVar53 | auVar54 & auVar67;
              auVar54 = ~auVar53 & auVar78 | auVar77 & auVar53;
              auVar73 = auVar54 ^ auVar20;
              auVar41 = auVar59 ^ auVar20;
              iVar66 = -(uint)(auVar73._0_4_ < auVar41._0_4_);
              iVar71 = -(uint)(auVar73._4_4_ < auVar41._4_4_);
              iVar70 = -(uint)(auVar73._8_4_ < auVar41._8_4_);
              iVar72 = -(uint)(auVar73._12_4_ < auVar41._12_4_);
              auVar75._4_4_ = iVar66;
              auVar75._0_4_ = iVar66;
              auVar75._8_4_ = iVar70;
              auVar75._12_4_ = iVar70;
              iVar66 = -(uint)(auVar41._4_4_ == auVar73._4_4_);
              iVar70 = -(uint)(auVar41._12_4_ == auVar73._12_4_);
              auVar60._4_4_ = iVar66;
              auVar60._0_4_ = iVar66;
              auVar60._8_4_ = iVar70;
              auVar60._12_4_ = iVar70;
              auVar42._4_4_ = iVar71;
              auVar42._0_4_ = iVar71;
              auVar42._8_4_ = iVar72;
              auVar42._12_4_ = iVar72;
              auVar42 = auVar42 | auVar60 & auVar75;
              auVar41 = ~auVar42 & auVar54 | auVar59 & auVar42;
              auVar73 = auVar41 ^ auVar20;
              auVar60 = auVar18 ^ auVar20;
              iVar66 = -(uint)(auVar60._0_4_ < auVar73._0_4_);
              iVar71 = -(uint)(auVar60._4_4_ < auVar73._4_4_);
              iVar70 = -(uint)(auVar60._8_4_ < auVar73._8_4_);
              iVar72 = -(uint)(auVar60._12_4_ < auVar73._12_4_);
              auVar76._4_4_ = iVar66;
              auVar76._0_4_ = iVar66;
              auVar76._8_4_ = iVar70;
              auVar76._12_4_ = iVar70;
              iVar66 = -(uint)(auVar60._4_4_ == auVar73._4_4_);
              iVar70 = -(uint)(auVar60._12_4_ == auVar73._12_4_);
              auVar79._4_4_ = iVar66;
              auVar79._0_4_ = iVar66;
              auVar79._8_4_ = iVar70;
              auVar79._12_4_ = iVar70;
              auVar61._4_4_ = iVar71;
              auVar61._0_4_ = iVar71;
              auVar61._8_4_ = iVar72;
              auVar61._12_4_ = iVar72;
              auVar61 = auVar61 | auVar79 & auVar76;
              auVar41 = ~auVar61 & auVar18 | auVar41 & auVar61;
              auVar73 = auVar41 ^ auVar20;
              iVar66 = -(uint)(auVar20._0_4_ < auVar73._0_4_);
              auVar43._4_4_ = -(uint)(auVar20._4_4_ < auVar73._4_4_);
              iVar70 = -(uint)(auVar20._8_4_ < auVar73._8_4_);
              auVar43._12_4_ = -(uint)(auVar20._12_4_ < auVar73._12_4_);
              auVar68._4_4_ = iVar66;
              auVar68._0_4_ = iVar66;
              auVar68._8_4_ = iVar70;
              auVar68._12_4_ = iVar70;
              auVar27._4_4_ = -(uint)(auVar73._4_4_ == auVar20._4_4_);
              auVar27._12_4_ = -(uint)(auVar73._12_4_ == auVar20._12_4_);
              auVar27._0_4_ = auVar27._4_4_;
              auVar27._8_4_ = auVar27._12_4_;
              auVar43._0_4_ = auVar43._4_4_;
              auVar43._8_4_ = auVar43._12_4_;
              auVar28._0_4_ = -(uint)(auVar81._0_4_ == -1);
              iVar49 = auVar81._4_4_;
              lVar37 = auVar81._8_8_;
              auVar28._4_4_ = -(uint)(iVar49 == -1);
              iVar51 = auVar81._12_4_;
              auVar28._8_4_ = -(uint)(auVar81._8_4_ == -1);
              auVar28._12_4_ = -(uint)(iVar51 == -1);
              auVar62._4_4_ = auVar28._0_4_;
              auVar62._0_4_ = auVar28._4_4_;
              auVar62._8_4_ = auVar28._12_4_;
              auVar62._12_4_ = auVar28._8_4_;
              auVar62 = auVar62 & auVar28;
              auVar41 = ~auVar62 & (auVar43 | auVar27 & auVar68) & auVar41;
              auVar73 = ~auVar62 & auVar18 | auVar25 & auVar62;
              auVar18 = auVar41 ^ auVar20;
              iVar66 = auVar18._0_4_;
              iVar70 = auVar18._4_4_;
              iVar71 = auVar18._8_4_;
              iVar72 = auVar18._12_4_;
              if (1 < uVar16) {
                auVar18 = local_118 ^ auVar20;
                iVar38 = -(uint)(auVar18._0_4_ < iVar66);
                auVar44._4_4_ = -(uint)(auVar18._4_4_ < iVar70);
                iVar50 = -(uint)(auVar18._8_4_ < iVar71);
                auVar44._12_4_ = -(uint)(auVar18._12_4_ < iVar72);
                auVar55._4_4_ = iVar38;
                auVar55._0_4_ = iVar38;
                auVar55._8_4_ = iVar50;
                auVar55._12_4_ = iVar50;
                auVar29._4_4_ = -(uint)(auVar18._4_4_ == iVar70);
                auVar29._12_4_ = -(uint)(auVar18._12_4_ == iVar72);
                auVar29._0_4_ = auVar29._4_4_;
                auVar29._8_4_ = auVar29._12_4_;
                auVar44._0_4_ = auVar44._4_4_;
                auVar44._8_4_ = auVar44._12_4_;
                auVar44 = auVar44 | auVar29 & auVar55;
                local_118 = local_118 & auVar44 | ~auVar44 & auVar41;
                auVar18 = local_128 ^ auVar20;
                iVar38 = -(uint)(iVar66 < auVar18._0_4_);
                auVar45._4_4_ = -(uint)(iVar70 < auVar18._4_4_);
                iVar50 = -(uint)(iVar71 < auVar18._8_4_);
                auVar45._12_4_ = -(uint)(iVar72 < auVar18._12_4_);
                auVar56._4_4_ = iVar38;
                auVar56._0_4_ = iVar38;
                auVar56._8_4_ = iVar50;
                auVar56._12_4_ = iVar50;
                auVar30._4_4_ = -(uint)(auVar18._4_4_ == iVar70);
                auVar30._12_4_ = -(uint)(auVar18._12_4_ == iVar72);
                auVar30._0_4_ = auVar30._4_4_;
                auVar30._8_4_ = auVar30._12_4_;
                auVar45._0_4_ = auVar45._4_4_;
                auVar45._8_4_ = auVar45._12_4_;
                auVar45 = auVar45 | auVar30 & auVar56;
                local_128 = local_128 & auVar45 | ~auVar45 & auVar41;
              }
              auVar54 = auVar25 & auVar62 | ~auVar62 & auVar54;
              auVar18 = local_f8 ^ auVar20;
              iVar38 = -(uint)(auVar18._0_4_ < (int)local_68._0_4_);
              auVar46._4_4_ = -(uint)(auVar18._4_4_ < (int)local_68._4_4_);
              iVar50 = -(uint)(auVar18._8_4_ < (int)local_68._8_4_);
              auVar46._12_4_ = -(uint)(auVar18._12_4_ < (int)local_68._12_4_);
              auVar57._4_4_ = iVar38;
              auVar57._0_4_ = iVar38;
              auVar57._8_4_ = iVar50;
              auVar57._12_4_ = iVar50;
              auVar31._4_4_ = -(uint)(auVar18._4_4_ == local_68._4_4_);
              auVar31._12_4_ = -(uint)(auVar18._12_4_ == local_68._12_4_);
              auVar31._0_4_ = auVar31._4_4_;
              auVar31._8_4_ = auVar31._12_4_;
              auVar46._0_4_ = auVar46._4_4_;
              auVar46._8_4_ = auVar46._12_4_;
              auVar32._8_8_ = -(ulong)(lVar37 < (long)uVar6);
              auVar32._0_8_ = -(ulong)(auVar81._0_8_ < (long)uVar6);
              auVar58._0_4_ = -(uint)(-1 < iVar49);
              auVar58._4_4_ = -(uint)(-1 < iVar49);
              auVar58._8_4_ = -(uint)(-1 < iVar51);
              auVar58._12_4_ = -(uint)(-1 < iVar51);
              auVar58 = auVar58 & auVar32 & (auVar46 | auVar31 & auVar57);
              auVar18 = local_98 ^ auVar20;
              iVar66 = -(uint)(auVar18._0_4_ < iVar66);
              iVar49 = -(uint)(auVar18._4_4_ < iVar70);
              iVar71 = -(uint)(auVar18._8_4_ < iVar71);
              iVar51 = -(uint)(auVar18._12_4_ < iVar72);
              auVar63._4_4_ = iVar66;
              auVar63._0_4_ = iVar66;
              auVar63._8_4_ = iVar71;
              auVar63._12_4_ = iVar71;
              auVar33._4_4_ = -(uint)(auVar18._4_4_ == iVar70);
              auVar33._12_4_ = -(uint)(auVar18._12_4_ == iVar72);
              auVar33._0_4_ = auVar33._4_4_;
              auVar33._8_4_ = auVar33._12_4_;
              auVar19._4_4_ = iVar49;
              auVar19._0_4_ = iVar49;
              auVar19._8_4_ = iVar51;
              auVar19._12_4_ = iVar51;
              auVar18 = (auVar19 | auVar33 & auVar63) & auVar58;
              auVar60 = auVar81 ^ auVar20;
              auVar79 = local_b8 ^ auVar20;
              iVar66 = -(uint)(auVar60._0_4_ < auVar79._0_4_);
              iVar70 = -(uint)(auVar60._4_4_ < auVar79._4_4_);
              iVar71 = -(uint)(auVar60._8_4_ < auVar79._8_4_);
              iVar72 = -(uint)(auVar60._12_4_ < auVar79._12_4_);
              iVar49 = -(uint)(auVar79._4_4_ == auVar60._4_4_);
              iVar51 = -(uint)(auVar79._12_4_ == auVar60._12_4_);
              auVar64._4_4_ = iVar66;
              auVar64._0_4_ = iVar66;
              auVar64._8_4_ = iVar71;
              auVar64._12_4_ = iVar71;
              auVar69._4_4_ = iVar49;
              auVar69._0_4_ = iVar49;
              auVar69._8_4_ = iVar51;
              auVar69._12_4_ = iVar51;
              auVar65._0_4_ = -(uint)(auVar41._0_4_ == local_98._0_4_);
              auVar65._4_4_ = -(uint)(auVar41._4_4_ == local_98._4_4_);
              auVar65._8_4_ = -(uint)(auVar41._8_4_ == local_98._8_4_);
              auVar65._12_4_ = -(uint)(auVar41._12_4_ == local_98._12_4_);
              auVar80._4_4_ = iVar70;
              auVar80._0_4_ = iVar70;
              auVar80._8_4_ = iVar72;
              auVar80._12_4_ = iVar72;
              local_98 = auVar18 & auVar41 | ~auVar18 & local_98;
              auVar34._4_4_ = auVar65._0_4_;
              auVar34._0_4_ = auVar65._4_4_;
              auVar34._8_4_ = auVar65._12_4_;
              auVar34._12_4_ = auVar65._8_4_;
              auVar58 = (auVar80 | auVar69 & auVar64) & auVar65 & auVar34 & auVar58;
              local_c8 = auVar58 & local_f8 | ~auVar58 & (auVar18 & local_f8 | ~auVar18 & local_c8);
              local_b8 = auVar58 & auVar81 | ~auVar58 & (auVar18 & auVar81 | ~auVar18 & local_b8);
              ptr_00[uVar16] = auVar41._0_8_;
              ptr_01[uVar16] = auVar73._0_8_;
              auVar81._0_8_ = auVar81._0_8_ + 1;
              auVar81._8_8_ = lVar37 + 1;
              uVar16 = uVar16 + 1;
              auVar18._8_8_ = lVar8;
              auVar18._0_8_ = lVar39;
            } while (s2Len + 1 != uVar16);
            local_f8._8_8_ = local_f8._8_8_ + 2;
            local_f8._0_8_ = local_f8._0_8_ + 2;
            uVar12 = uVar12 + 2;
            local_68 = auVar23;
          } while ((long)uVar12 < lVar14);
        }
        lVar14 = 0;
        iVar4 = 0;
        iVar7 = 0;
        bVar3 = true;
        do {
          bVar11 = bVar3;
          lVar8 = *(long *)(local_98 + lVar14);
          if (lVar10 < lVar8) {
            iVar4 = *(int *)(local_c8 + lVar14);
            lVar10 = lVar8;
            iVar7 = *(int *)(local_b8 + lVar14);
          }
          else if (lVar8 == lVar10) {
            lVar8 = *(long *)(local_b8 + lVar14);
            if (lVar8 < iVar7) {
              iVar4 = *(int *)(local_c8 + lVar14);
              iVar7 = (int)lVar8;
            }
            else if ((lVar8 == iVar7) && (*(long *)(local_c8 + lVar14) < (long)iVar4)) {
              iVar4 = (int)*(long *)(local_c8 + lVar14);
              iVar7 = (int)lVar8;
            }
          }
          lVar14 = lVar14 + 8;
          bVar3 = false;
        } while (bVar11);
        iVar26 = -(uint)((int)((uint)local_a0 ^ 0x80000000) < (int)(local_118._0_4_ ^ 0x80000000));
        auVar35._4_4_ = -(uint)(local_a0._4_4_ < (int)local_118._4_4_);
        iVar66 = -(uint)((int)((uint)local_a0 ^ 0x80000000) < (int)(local_118._8_4_ ^ 0x80000000));
        auVar35._12_4_ = -(uint)(local_a0._4_4_ < (int)local_118._12_4_);
        auVar47._4_4_ = iVar26;
        auVar47._0_4_ = iVar26;
        auVar47._8_4_ = iVar66;
        auVar47._12_4_ = iVar66;
        auVar20._4_4_ = -(uint)(local_a0._4_4_ == local_118._4_4_);
        auVar20._12_4_ = -(uint)(local_a0._4_4_ == local_118._12_4_);
        auVar20._0_4_ = auVar20._4_4_;
        auVar20._8_4_ = auVar20._12_4_;
        auVar35._0_4_ = auVar35._4_4_;
        auVar35._8_4_ = auVar35._12_4_;
        auVar21._8_4_ = 0xffffffff;
        auVar21._0_8_ = 0xffffffffffffffff;
        auVar21._12_4_ = 0xffffffff;
        iVar26 = -(uint)((int)(uVar17 ^ 0x80000000) < (int)(local_128._0_4_ ^ 0x80000000));
        auVar24._4_4_ = -(uint)(iVar22 < (int)local_128._4_4_);
        iVar66 = -(uint)((int)(uVar17 ^ 0x80000000) < (int)(local_128._8_4_ ^ 0x80000000));
        auVar24._12_4_ = -(uint)(iVar22 < (int)local_128._12_4_);
        auVar48._4_4_ = iVar26;
        auVar48._0_4_ = iVar26;
        auVar48._8_4_ = iVar66;
        auVar48._12_4_ = iVar66;
        auVar36._4_4_ = -(uint)(iVar22 == local_128._4_4_);
        auVar36._12_4_ = -(uint)(iVar22 == local_128._12_4_);
        auVar36._0_4_ = auVar36._4_4_;
        auVar36._8_4_ = auVar36._12_4_;
        auVar24._0_4_ = auVar24._4_4_;
        auVar24._8_4_ = auVar24._12_4_;
        auVar25 = auVar24 | auVar36 & auVar48 | auVar21 ^ (auVar35 | auVar20 & auVar47);
        if ((((((((((((((((auVar25 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar25 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar25 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar25 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar25 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar25 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar25 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar25 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar25 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar25 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar25 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar25 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar25 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar25 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar25 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar25[0xf] < '\0') {
          *(byte *)&ppVar5->flag = (byte)ppVar5->flag | 0x40;
          lVar10 = 0;
          iVar7 = 0;
          iVar4 = 0;
        }
        ppVar5->score = (int)lVar10;
        ppVar5->end_query = iVar4;
        ppVar5->end_ref = iVar7;
        local_58 = auVar2;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(local_140);
          return ppVar5;
        }
        return ppVar5;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vNH, vOpen),
                    _mm_sub_epi64(vF, vGap));
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vWH, vOpen),
                    _mm_sub_epi64(vE, vGap));
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            vWH = _mm_max_epi64_rpl(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64_rpl(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi64_rpl(vJ, vNegOne),
                        _mm_cmplt_epi64_rpl(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi64_rpl(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi64_rpl(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8_rpl(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}